

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall SocketReceiveMultiplexer::Implementation::~Implementation(Implementation *this)

{
  pointer pAVar1;
  pointer ppVar2;
  
  close(this->breakPipe_[0]);
  close(this->breakPipe_[1]);
  pAVar1 = (this->timerListeners_).
           super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1,(long)(this->timerListeners_).
                                 super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar1);
  }
  ppVar2 = (this->socketListeners_).
           super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2,(long)(this->socketListeners_).
                                 super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2);
    return;
  }
  return;
}

Assistant:

~Implementation()
	{
		close( breakPipe_[0] );
		close( breakPipe_[1] );
	}